

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O1

void __thiscall
TPZReducedSpace::ComputeShape(TPZReducedSpace *this,TPZVec<double> *qsi,TPZMaterialData *data)

{
  long lVar1;
  
  lVar1 = __dynamic_cast(data,&TPZMaterialData::typeinfo,&TPZMaterialDataT<double>::typeinfo,0);
  if (lVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual void TPZReducedSpace::ComputeShape(TPZVec<REAL> &, TPZMaterialData &)",0x4d)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"is not available to complex types yet.\nAborting...\n",0x33);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzreducedspace.cpp"
               ,0xb5);
  }
  (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x318))
            (this,qsi,lVar1);
  return;
}

Assistant:

void TPZReducedSpace::ComputeShape(TPZVec<REAL> &qsi,TPZMaterialData &data){
    auto *tmp = dynamic_cast<TPZMaterialDataT<STATE>*>(&data);
    if(!tmp){
        PZError<<__PRETTY_FUNCTION__;
        PZError<< "is not available to complex types yet.\nAborting...\n";
        DebugStop();
    }
    ShapeX(qsi,*tmp);
}